

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

void __thiscall Executor::visit(Executor *this,FunctionResultCallNode *node)

{
  ExpressionNode *pEVar1;
  Value *value;
  Executor *this_00;
  allocator<char> local_3d;
  TypeName local_3c;
  
  pEVar1 = (node->call_)._M_t.
           super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
           super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
           super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
  (**(code **)((long)(pEVar1->super_Node)._vptr_Node + 0x10))(pEVar1,this);
  value = (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
          super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
          super__Head_base<0UL,_Value_*,_false>._M_head_impl;
  local_3c = Function;
  this_00 = (Executor *)&stack0xffffffffffffffc8;
  std::__cxx11::string::string<std::allocator<char>>((string *)this_00,"function call",&local_3d);
  assertValueType(this_00,value,&local_3c,(string *)&stack0xffffffffffffffc8,(Node *)node);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffffc8,"result",(allocator<char> *)&local_3c);
  callValue(this,&node->super_CallNode,(string *)&stack0xffffffffffffffc8,
            (this->value_)._M_t.super___uniq_ptr_impl<Value,_std::default_delete<Value>_>._M_t.
            super__Tuple_impl<0UL,_Value_*,_std::default_delete<Value>_>.
            super__Head_base<0UL,_Value_*,_false>._M_head_impl);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

void Executor::visit(const FunctionResultCallNode& node)
{
  node.getCall().accept(*this);
  assertValueType(*value_, TypeName::Function, "function call", node);

  callValue(node, "result", *value_);
}